

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSerialPort.cpp
# Opt level: O1

ssize_t __thiscall PosixSerialPort::write(PosixSerialPort *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  undefined4 in_register_00000034;
  
  if (this->_devfd == -1) {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = ::write(this->_devfd,(void *)CONCAT44(in_register_00000034,__fd),(long)(int)__buf);
    if (this->_autoFlush == true) {
      (*(this->super_SerialPort)._vptr_SerialPort[10])(this);
    }
  }
  return uVar1 & 0xffffffff;
}

Assistant:

int
PosixSerialPort::write(const uint8_t* buffer, int len)
{
    if (_devfd == -1)
        return -1;

    int res = ::write(_devfd, buffer, len);
    // Used on macos to avoid upload errors
    if (_autoFlush)
        flush();
    return res;
}